

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::BodyExpr::BodyExpr
          (BodyExpr *this,Lexer *lex,Position *pos,Exprs *exprs,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *retExpr,
          ReturnControlType rct)

{
  ReturnControlType rct_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *retExpr_local;
  Exprs *exprs_local;
  Position *pos_local;
  Lexer *lex_local;
  BodyExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lex,EXPR_BODY,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__BodyExpr_00176a10;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector(&this->exprs,exprs);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
            (&this->retExpr,retExpr);
  this->rct = rct;
  _setParents<pfederc::Expr>(&this->exprs,&this->super_Expr);
  _setParent<pfederc::Expr>(&this->retExpr,&this->super_Expr);
  return;
}

Assistant:

BodyExpr::BodyExpr(const Lexer &lex, const Position &pos,
     Exprs &&exprs, std::unique_ptr<Expr> &&retExpr,
     ReturnControlType rct) noexcept
     : Expr(lex, ExprType::EXPR_BODY, pos), exprs(std::move(exprs)),
       retExpr(std::move(retExpr)), rct{rct} {
  
  _setParents(this->exprs, this);
  _setParent(this->retExpr, this);
}